

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O2

uint32 Js::UriHelper::ToUTF8(uint32 uVal,BYTE *bUTF8)

{
  code *pcVar1;
  uint32 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte bVar5;
  
  bVar5 = (byte)uVal;
  if (uVal < 0x80) {
    *bUTF8 = bVar5;
    uVar2 = 1;
  }
  else if (uVal < 0x800) {
    *bUTF8 = (byte)(uVal >> 6) | 0xc0;
    bUTF8[1] = bVar5 & 0x3f | 0x80;
    uVar2 = 2;
  }
  else if (uVal < 0x10000) {
    if (0xfffff7ff < uVal - 0xe000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0x4d,"(uVal <= 0xD7FF || uVal >= 0xE000)",
                                  "uVal <= 0xD7FF || uVal >= 0xE000");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    *bUTF8 = (byte)(uVal >> 0xc) | 0xe0;
    bUTF8[1] = (byte)(uVal >> 6) & 0x3f | 0x80;
    bUTF8[2] = bVar5 & 0x3f | 0x80;
    uVar2 = 3;
  }
  else {
    *(uint32 *)bUTF8 =
         uVal >> 0x12 & 0xffff00ff | (uint)((byte)(uVal >> 0xc) & 0x3f) << 8 |
         (uint)((byte)(uVal >> 6) & 0x3f) << 0x10 | (uint)(bVar5 & 0x3f) << 0x18 |
         (uint)DAT_00eb3120;
    uVar2 = 4;
  }
  return uVar2;
}

Assistant:

uint32 UriHelper::ToUTF8( uint32 uVal, BYTE bUTF8[MaxUTF8Len])
    {
        uint32 uRet;
        if( uVal <= 0x007F )
        {
            bUTF8[0] = (BYTE)uVal;
            uRet = 1;
        }
        else if( uVal <= 0x07FF )
        {
            uint32 z = uVal & 0x3F;
            uint32 y = uVal >> 6;
            bUTF8[0] = (BYTE) (0xC0 | y);
            bUTF8[1] = (BYTE) (0x80 | z);
            uRet = 2;
        }
        else if( uVal <= 0xFFFF )
        {
            Assert( uVal <= 0xD7FF || uVal >= 0xE000 );
            uint32 z = uVal & 0x3F;
            uint32 y = (uVal >> 6) & 0x3F;
            uint32 x = (uVal >> 12);
            bUTF8[0] = (BYTE) (0xE0 | x);
            bUTF8[1] = (BYTE) (0x80 | y);
            bUTF8[2] = (BYTE) (0x80 | z);
            uRet = 3;
        }
        else
        {
            uint32 z = uVal & 0x3F;
            uint32 y = (uVal >> 6) &0x3F;
            uint32 x = (uVal >> 12) &0x3F;
            uint32 w = (uVal >> 18);
            bUTF8[0] = (BYTE) (0xF0 | w);
            bUTF8[1] = (BYTE) (0x80 | x);
            bUTF8[2] = (BYTE) (0x80 | y);
            bUTF8[3] = (BYTE) (0x80 | z);
            uRet = 4;
        }

        return uRet;
    }